

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

int spki_table_get_all(spki_table *spki_table,uint32_t asn,uint8_t *ski,spki_record **result,
                      uint *result_size)

{
  long lVar1;
  key_entry *key_e;
  tommy_uint32_t hash_00;
  int iVar2;
  spki_record *psVar3;
  long in_FS_OFFSET;
  key_entry *element;
  void *tmp;
  tommy_node *result_bucket;
  uint32_t hash;
  uint *result_size_local;
  spki_record **result_local;
  uint8_t *ski_local;
  uint32_t asn_local;
  spki_table *spki_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash_00 = tommy_inthash_u32(asn);
  *result = (spki_record *)0x0;
  *result_size = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&spki_table->lock);
  tmp = tommy_hashlin_bucket(&spki_table->hashtable,hash_00);
  if ((tommy_hashlin_node *)tmp == (tommy_hashlin_node *)0x0) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
    spki_table_local._4_4_ = 0;
  }
  else {
    for (; tmp != (void *)0x0; tmp = *tmp) {
      key_e = *(key_entry **)((long)tmp + 0x10);
      if ((key_e->asn == asn) && (iVar2 = memcmp(key_e,ski,0x14), iVar2 == 0)) {
        *result_size = *result_size + 1;
        psVar3 = (spki_record *)lrtr_realloc(*result,(ulong)*result_size << 7);
        if (psVar3 == (spki_record *)0x0) {
          lrtr_free(*result);
          pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
          spki_table_local._4_4_ = -1;
          goto LAB_001109c1;
        }
        *result = psVar3;
        key_entry_to_spki_record(key_e,*result + ((ulong)*result_size - 1));
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
    spki_table_local._4_4_ = 0;
  }
LAB_001109c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return spki_table_local._4_4_;
}

Assistant:

int spki_table_get_all(struct spki_table *spki_table, uint32_t asn, uint8_t *ski, struct spki_record **result,
		       unsigned int *result_size)
{
	uint32_t hash = tommy_inthash_u32(asn);
	tommy_node *result_bucket;
	void *tmp;

	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	/**
	 * A tommy node contains its storing key_entry (->data) as well as
	 * next and prev pointer to accommodate multiple results.
	 * The bucket is guaranteed to contain ALL the elements
	 * with the specified hash, but it can contain also others.
	 */
	result_bucket = tommy_hashlin_bucket(&spki_table->hashtable, hash);

	if (!result_bucket) {
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_SUCCESS;
	}

	/* Build the result array */
	while (result_bucket) {
		struct key_entry *element;

		element = result_bucket->data;
		if (element->asn == asn && memcmp(element->ski, ski, sizeof(element->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, *result_size * sizeof(**result));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(element, *result + *result_size - 1);
		}
		result_bucket = result_bucket->next;
	}

	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}